

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

void check_redraw_corresponding_parent(Fl_Type *s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fl_Type *pFVar2;
  Fl_Type *pFVar3;
  
  if (((s != (Fl_Type *)0x0) && (s->selected != '\0')) &&
     (iVar1 = (*s->_vptr_Fl_Type[0x17])(s), iVar1 != 0)) {
    pFVar2 = (Fl_Type *)0x0;
    pFVar3 = s;
    do {
      if (pFVar3->parent == (Fl_Type *)0x0) {
        return;
      }
      iVar1 = (*pFVar3->_vptr_Fl_Type[0x20])(pFVar3);
      if ((iVar1 != 0) && (pFVar2 != (Fl_Type *)0x0)) {
        iVar1 = (*pFVar3->_vptr_Fl_Type[5])(pFVar3);
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"Fl_Tabs");
        if (iVar1 == 0) {
LAB_0018df25:
          Fl_Tabs::value((Fl_Tabs *)pFVar3[1].prev,(Fl_Widget *)pFVar2[1].prev);
          return;
        }
        iVar1 = (*pFVar3->_vptr_Fl_Type[5])(pFVar3);
        iVar1 = strcmp((char *)CONCAT44(extraout_var_00,iVar1),"Fl_Wizard");
        if (iVar1 == 0) goto LAB_0018df25;
      }
      iVar1 = (*pFVar3->_vptr_Fl_Type[0x20])(pFVar3);
      if ((iVar1 != 0) && (iVar1 = (*s->_vptr_Fl_Type[0x17])(s), iVar1 != 0)) {
        pFVar2 = pFVar3;
      }
      pFVar3 = pFVar3->parent;
    } while (pFVar3 != (Fl_Type *)0x0);
  }
  return;
}

Assistant:

void check_redraw_corresponding_parent(Fl_Type *s) {
    Fl_Widget_Type * prev_parent = 0;
    if( !s || !s->selected || !s->is_widget()) return;
    for (Fl_Type *i=s; i && i->parent; i=i->parent) {
	if (i->is_group() && prev_parent && 
	    (!strcmp(i->type_name(), "Fl_Tabs") || 
	     !strcmp(i->type_name(), "Fl_Wizard"))) {
	     ((Fl_Tabs*)((Fl_Widget_Type*)i)->o)->value(prev_parent->o);
	     return;
	}
	if (i->is_group() && s->is_widget()) 
	    prev_parent = (Fl_Widget_Type*)i;
    }
}